

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t main(wchar_t argc,char **argv)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  __mode_t __mask;
  wchar_t wVar5;
  wchar_t wVar6;
  char *__s;
  size_t sVar7;
  char *__dest;
  size_t sVar8;
  char *pcVar9;
  tm *__tp;
  char *pcVar10;
  long *__s_00;
  long lVar11;
  int iVar12;
  int iVar13;
  byte bVar14;
  char *pcVar15;
  int iVar16;
  char cVar17;
  byte *pbVar18;
  byte *pbVar19;
  char **ppcVar20;
  uint uVar21;
  uint uVar22;
  char **ppcVar23;
  long *plVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  int *piVar28;
  bool bVar29;
  char *local_31a8;
  char *local_31a0;
  uint local_3194;
  char *local_3188;
  char *local_3180;
  char *local_3178;
  char *local_3160;
  time_t now;
  wchar_t test_set [23];
  char tmpdir_timestamp [32];
  char local_30b8 [72];
  tm tmbuf;
  char tmpdir [4096];
  sigaction sa;
  
  __s = getcwd((char *)0x0,0);
  sVar7 = strlen(__s);
  cVar17 = __s[sVar7 - 1];
  while (cVar17 == '\n') {
    __s[sVar7 - 1] = '\0';
    sVar7 = strlen(__s);
    cVar17 = __s[sVar7 - 1];
  }
  pcVar10 = *argv;
  sVar7 = strlen(pcVar10);
  pcVar15 = (char *)(sVar7 + 1);
  pcVar9 = pcVar15;
  __dest = (char *)malloc((size_t)pcVar15);
  if (__dest == (char *)0x0) goto LAB_0010507f;
  strncpy(__dest,pcVar10,(size_t)pcVar15);
  iVar12 = 0;
  iVar13 = 0;
  pcVar9 = pcVar10;
  while( true ) {
    pcVar15 = pcVar9 + 1;
    cVar17 = *pcVar9;
    pcVar9 = pcVar15;
    iVar16 = iVar12;
    if (((cVar17 != '/') && (cVar17 != '\\')) && (pcVar9 = pcVar10, iVar16 = iVar13, cVar17 == '\0')
       ) break;
    iVar12 = iVar12 + 1;
    pcVar10 = pcVar9;
    iVar13 = iVar16;
    pcVar9 = pcVar15;
  }
  __dest[iVar13] = '\0';
  if (*__dest == '/') {
LAB_00103fbe:
    testprogfile = getenv("BSDUNZIP");
    local_31a8 = getenv("TMPDIR");
    if (((local_31a8 == (char *)0x0) && (local_31a8 = getenv("TMP"), local_31a8 == (char *)0x0)) &&
       (local_31a8 = getenv("TEMP"), local_31a8 == (char *)0x0)) {
      pcVar9 = getenv("TEMPDIR");
      local_31a8 = "/tmp";
      if (pcVar9 != (char *)0x0) {
        local_31a8 = pcVar9;
      }
    }
    sVar7 = strlen(local_31a8);
    uVar26 = sVar7 + 1;
    do {
      if (uVar26 == 1) {
        uVar27 = 0;
        break;
      }
      uVar27 = uVar26 - 1;
      lVar25 = uVar26 - 2;
      uVar26 = uVar27;
    } while (local_31a8[lVar25] == '/');
    pcVar9 = getenv("BSDUNZIP_DEBUG");
    if (pcVar9 != (char *)0x0) {
      dump_on_failure = 1;
    }
    pcVar9 = getenv("_VERBOSITY_LEVEL");
    if (pcVar9 == (char *)0x0) {
      bVar29 = true;
    }
    else {
      wVar3 = atoi(pcVar9);
      bVar29 = (uint)(wVar3 + L'\xfffffffd') < 0xfffffffc;
      verbosity = L'\0';
      if (!bVar29) {
        verbosity = wVar3;
      }
    }
    refdir = getenv("BSDUNZIP_TEST_FILES");
    ppcVar23 = argv + 1;
    pcVar9 = argv[1];
    wVar3 = verbosity;
    wVar6 = until_failure;
    while ((pcVar9 != (char *)0x0 && (*pcVar9 == '-'))) {
      ppcVar23 = ppcVar23 + 1;
      bVar14 = pcVar9[1];
      if (bVar14 != 0) {
        pbVar18 = (byte *)(pcVar9 + 1);
        do {
          pbVar18 = pbVar18 + 1;
          if ((bVar14 & 0xfd) == 0x70) {
            pbVar19 = pbVar18;
            if (*pbVar18 == 0) {
              pbVar19 = (byte *)*ppcVar23;
              if (pbVar19 == (byte *)0x0) goto LAB_00105039;
              ppcVar23 = ppcVar23 + 1;
            }
            pbVar18 = (byte *)0x108504;
          }
          else {
            pbVar19 = (byte *)0x0;
          }
          switch(bVar14) {
          case 100:
            dump_on_failure = 1;
            break;
          default:
            goto switchD_00104147_caseD_65;
          case 0x6b:
            keep_temp_files = 1;
            break;
          case 0x70:
            testprogfile = (char *)pbVar19;
            break;
          case 0x71:
            if (bVar29) {
              wVar3 = wVar3 + L'\xffffffff';
              verbosity = wVar3;
            }
            break;
          case 0x72:
            refdir = (char *)pbVar19;
            break;
          case 0x73:
            fail_if_tests_skipped = 1;
            break;
          case 0x75:
            wVar6 = wVar6 + L'\x01';
            until_failure = wVar6;
            break;
          case 0x76:
            if (bVar29) {
              wVar3 = wVar3 + L'\x01';
              verbosity = wVar3;
            }
          }
          bVar14 = *pbVar18;
        } while (bVar14 != 0);
      }
      pcVar9 = *ppcVar23;
    }
    if (testprogfile == (char *)0x0) {
      sVar7 = strlen(__dest);
      pcVar15 = (char *)(sVar7 + 10);
      pcVar9 = pcVar15;
      local_3180 = (char *)malloc((size_t)pcVar15);
      if (local_3180 == (char *)0x0) goto LAB_00105098;
      strncpy(local_3180,__dest,(size_t)pcVar15);
      strncat(local_3180,"/",(size_t)pcVar15);
      strncat(local_3180,"bsdunzip",(size_t)pcVar15);
      testprogfile = local_3180;
    }
    else {
      local_3180 = (char *)0x0;
    }
    pcVar9 = testprogfile;
    sVar7 = strlen(testprogfile);
    sVar7 = sVar7 + 3;
    pcVar15 = (char *)malloc(sVar7);
    strncpy(pcVar15,"\"",sVar7);
    strncat(pcVar15,pcVar9,sVar7);
    pcVar9 = pcVar15;
    strncat(pcVar15,"\"",sVar7);
    testprog = pcVar15;
    if ((refdir == (char *)0x0) || (*refdir == '/')) {
      sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.sa_flags = L'\0';
      sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
      now = time((time_t *)0x0);
      local_31a0 = (char *)(uVar27 - 0xffa);
      uVar26 = 0;
      do {
        __tp = localtime_r(&now,(tm *)&tmbuf);
        strftime(tmpdir_timestamp,0x20,"%Y-%m-%dT%H.%M.%S",__tp);
        sVar7 = strlen(pcVar10);
        sVar8 = strlen(tmpdir_timestamp);
        local_3178 = __dest;
        local_3160 = pcVar10;
        if (local_31a0 + sVar8 + sVar7 < (char *)0xfffffffffffff000) goto LAB_00105041;
        snprintf(tmpdir,0x1000,"%.*s/%s.%s-%03d",uVar27 & 0xffffffff,local_31a8,pcVar10,
                 tmpdir_timestamp,uVar26);
        wVar3 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                   ,L'ၛ',tmpdir,L'ǭ');
        if (wVar3 != L'\0') goto LAB_001043ca;
        uVar21 = (int)uVar26 + 1;
        uVar26 = (ulong)uVar21;
      } while (uVar21 != 1000);
      main_cold_10();
LAB_001043ca:
      plVar24 = (long *)refdir;
      pcVar9 = (char *)0x1000;
      pcVar10 = (char *)calloc(0x1000,1);
      if (pcVar10 == (char *)0x0) goto LAB_00105084;
      pcVar9 = (char *)0x2000;
      pcVar15 = (char *)calloc(0x2000,1);
      if (pcVar15 != (char *)0x0) {
        if (plVar24 == (long *)0x0) {
          __s_00 = (long *)getcwd((char *)0x0,0);
          sVar7 = strlen((char *)__s_00);
          cVar17 = *(char *)((long)__s_00 + (sVar7 - 1));
          while (cVar17 == '\n') {
            *(undefined1 *)((long)__s_00 + (sVar7 - 1)) = 0;
            sVar7 = strlen((char *)__s_00);
            cVar17 = *(char *)((long)__s_00 + (sVar7 - 1));
          }
          snprintf(pcVar10,0x1000,"%s",__s_00);
          pcVar9 = slurpfile((size_t *)0x0,"%s/%s",pcVar10,"test_basic.zip.uu");
          if (pcVar9 != (char *)0x0) goto LAB_0010474b;
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,pcVar10,0x1fff - sVar7);
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,"\n",0x1fff - sVar7);
          snprintf(pcVar10,0x1000,"%s/test",__s_00);
          pcVar9 = slurpfile((size_t *)0x0,"%s/%s",pcVar10,"test_basic.zip.uu");
          if (pcVar9 != (char *)0x0) goto LAB_0010474b;
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,pcVar10,0x1fff - sVar7);
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,"\n",0x1fff - sVar7);
          snprintf(pcVar10,0x1000,"%s/%s/test",__s_00,"bsdunzip");
          pcVar9 = slurpfile((size_t *)0x0,"%s/%s",pcVar10,"test_basic.zip.uu");
          if (pcVar9 != (char *)0x0) goto LAB_0010474b;
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,pcVar10,0x1fff - sVar7);
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,"\n",0x1fff - sVar7);
          snprintf(pcVar10,0x1000,"%s/%s/test",__s_00,"unzip");
          pcVar9 = slurpfile((size_t *)0x0,"%s/%s",pcVar10,"test_basic.zip.uu");
          if (pcVar9 != (char *)0x0) goto LAB_0010474b;
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,pcVar10,0x1fff - sVar7);
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,"\n",0x1fff - sVar7);
          if (*__s_00 != 0x6a626f2f7273752f) goto LAB_0010448d;
          plVar24 = __s_00 + 1;
          snprintf(pcVar10,0x1000,"%s",plVar24);
          pcVar9 = slurpfile((size_t *)0x0,"%s/%s",pcVar10,"test_basic.zip.uu");
          if (pcVar9 != (char *)0x0) goto LAB_0010474b;
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,pcVar10,0x1fff - sVar7);
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,"\n",0x1fff - sVar7);
          pcVar9 = "%s/test";
        }
        else {
          pcVar9 = "%s";
          __s_00 = (long *)0x0;
        }
        snprintf(pcVar10,0x1000,pcVar9,plVar24);
        pcVar9 = slurpfile((size_t *)0x0,"%s/%s",pcVar10,"test_basic.zip.uu");
        if (pcVar9 == (char *)0x0) {
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,pcVar10,0x1fff - sVar7);
          sVar7 = strlen(pcVar15);
          strncat(pcVar15,"\n",0x1fff - sVar7);
LAB_0010448d:
          printf("Unable to locate known reference file %s\n","test_basic.zip.uu");
          printf("  Checked following directories:\n%s\n",pcVar15);
          puts("Use -r option to specify full path to reference directory");
          exit(1);
        }
LAB_0010474b:
        free(pcVar9);
        free(__s_00);
        free(pcVar15);
        local_3188 = strdup(pcVar10);
        free(pcVar10);
        refdir = local_3188;
        putchar(10);
        puts("If tests fail or crash, details will be in:");
        printf("   %s\n",tmpdir);
        putchar(10);
        if (verbosity < L'\0') {
          printf("Running ");
          fflush(_stdout);
        }
        else {
          printf("Reference files will be read from: %s\n",refdir);
          printf("Running tests on: %s\n",testprog);
          printf("Exercising: ");
          fflush(_stdout);
          systemf("%s --version",testprog);
          putchar(10);
        }
        local_3194 = 0;
        local_31a8 = (char *)0x0;
        ppcVar20 = ppcVar23;
        do {
          local_31a0 = *ppcVar20;
          if (local_31a0 == (char *)0x0) {
            lVar25 = 0;
            do {
              test_set[lVar25] = (wchar_t)lVar25;
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0x17);
            uVar22 = 0x17;
          }
          else {
            cVar17 = *local_31a0;
            if (9 < (byte)(cVar17 - 0x30U)) {
              lVar25 = 0;
              uVar21 = 0;
LAB_00104945:
              pcVar10 = tests[lVar25].name;
              pcVar9 = local_31a0 + (cVar17 == '^');
              do {
                if (*pcVar9 != '\\') {
                  if (*pcVar9 != '*') goto LAB_00104995;
                  for (; *pcVar9 == '*'; pcVar9 = pcVar9 + 1) {
                  }
                  if (*pcVar9 == '\\') {
                    pcVar9 = pcVar9 + 1;
                  }
                  pcVar10 = strchr(pcVar10,(int)*pcVar9);
                  if (pcVar10 != (char *)0x0) goto LAB_00104995;
LAB_001049a9:
                  bVar1 = false;
                  bVar29 = true;
                  goto LAB_001049b9;
                }
                pcVar9 = pcVar9 + 1;
LAB_00104995:
                if (*pcVar9 != *pcVar10) goto LAB_001049a9;
                if (*pcVar9 == '\0') goto LAB_001049b2;
                pcVar9 = pcVar9 + 1;
                pcVar10 = pcVar10 + 1;
              } while( true );
            }
            pcVar10 = local_31a0 + 1;
            pcVar9 = local_31a0 + 3;
            iVar13 = 0;
            do {
              iVar12 = iVar13;
              pcVar15 = pcVar9;
              bVar14 = cVar17 - 0x30;
              iVar13 = (uint)bVar14 + iVar12 * 10;
              cVar17 = *pcVar10;
              pcVar10 = pcVar10 + 1;
              pcVar9 = pcVar15 + 1;
            } while ((byte)(cVar17 - 0x30U) < 10);
            iVar16 = iVar13;
            if (cVar17 == '\0') {
LAB_001049e2:
              uVar26 = 0;
              if ((iVar13 < 0) || (0x16 < iVar16)) {
                bVar29 = false;
              }
              else {
                bVar29 = false;
                if (iVar13 <= iVar16) {
                  uVar26 = 0;
                  do {
                    test_set[uVar26] = (uint)bVar14 + iVar12 * 10 + (int)uVar26;
                    uVar26 = uVar26 + 1;
                  } while ((iVar16 - iVar13) + 1 != uVar26);
                  bVar29 = true;
                }
              }
            }
            else {
              uVar26 = 0;
              bVar29 = false;
              if (cVar17 == '-') {
                cVar17 = *pcVar10;
                if (cVar17 == '\0') {
                  iVar16 = 0x16;
                }
                else {
                  iVar16 = 0;
                  if ((byte)(cVar17 - 0x30U) < 10) {
                    iVar16 = 0;
                    do {
                      iVar16 = (uint)(byte)(cVar17 - 0x30) + iVar16 * 10;
                      cVar17 = *pcVar15;
                      pcVar15 = pcVar15 + 1;
                    } while ((byte)(cVar17 - 0x30U) < 10);
                  }
                }
                goto LAB_001049e2;
              }
            }
            uVar21 = (uint)uVar26;
            uVar22 = 0xffffffff;
            if (bVar29) {
LAB_00104a27:
              uVar22 = -(uint)(uVar21 == 0) | uVar21;
            }
          }
          if ((int)uVar22 < 0) goto LAB_0010504e;
          if ((int)uVar22 < 2) {
            uVar22 = 1;
          }
          iVar13 = (int)local_31a8;
          uVar26 = 0;
          do {
            wVar2 = skips;
            wVar6 = failures;
            wVar3 = test_set[uVar26];
            local_31a0 = (char *)CONCAT44(local_31a0._4_4_,failures);
            if (verbosity != L'\xffffffff') {
              if (verbosity == L'\0') {
                printf("%3d: %-64s",(ulong)(uint)wVar3,tests[wVar3].name);
                fflush(_stdout);
              }
              else {
                printf("%3d: %s\n",(ulong)(uint)wVar3,tests[wVar3].name);
              }
            }
            wVar4 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                    ,L'ก',tmpdir);
            if (wVar4 == L'\0') {
LAB_0010501f:
              main_cold_7();
LAB_0010502c:
              main_cold_5();
LAB_00105039:
              main_cold_3();
              goto LAB_00105041;
            }
            snprintf(local_30b8,0x40,"%s.log",tests[wVar3].name);
            logfile = (FILE *)fopen(local_30b8,"w");
            fprintf((FILE *)logfile,"%s\n\n",tests[wVar3].name);
            snprintf((char *)&sa,0x2000,"%s/%s",tmpdir,tests[wVar3].name);
            testworkdir = (char *)&sa;
            wVar4 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                       ,L'ญ',(char *)&sa,L'ǭ');
            if ((wVar4 == L'\0') ||
               (wVar4 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                        ,L'ฎ',testworkdir), wVar4 == L'\0')) {
              main_cold_6();
              goto LAB_0010501f;
            }
            setlocale(6,"C");
            __mask = umask(0);
            umask(__mask);
            (*tests[wVar3].func)();
            testworkdir = (char *)0x0;
            umask(__mask);
            setlocale(6,"C");
            wVar5 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                    ,L'ฤ',tmpdir);
            wVar4 = failures;
            if (wVar5 == L'\0') goto LAB_0010502c;
            tests[wVar3].failures = failures - wVar6;
            if (verbosity == L'\0') {
              pcVar10 = "skipped\n";
              if (skips == wVar2) {
                pcVar10 = "ok\n";
              }
              if (wVar4 != wVar6) {
                pcVar10 = "FAIL\n";
              }
              printf(pcVar10);
            }
            else if (verbosity == L'\xffffffff') {
              pcVar10 = "E";
              if (wVar4 == wVar6) {
                pcVar10 = ".";
              }
              printf(pcVar10);
              fflush(_stdout);
            }
            local_31a8 = (char *)(ulong)((int)local_31a8 + 1);
            log_console = (wchar_t)(verbosity == L'\x01');
            uVar27 = 0;
            do {
              if ((1 < failed_lines[uVar27].count) && (failed_lines[uVar27].skip == 0)) {
                logprintf("%s:%u: Summary: Failed %d times\n",failed_filename,uVar27 & 0xffffffff);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != 10000);
            failed_filename = (char *)0x0;
            memset(failed_lines,0,80000);
            fclose((FILE *)logfile);
            logfile = (FILE *)0x0;
            if (((tests[wVar3].failures == 0) && ((keep_temp_files & 1) == 0)) &&
               (wVar6 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                        ,L'ั',tmpdir), wVar6 != L'\0')) {
              systemf("rm -rf %s",tests[wVar3].name);
              systemf("rm %s",local_30b8);
            }
            if ((tests[wVar3].failures != 0) &&
               (local_3194 = local_3194 + 1, until_failure != L'\0')) {
              iVar12 = 0x17;
              goto LAB_00104dfd;
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar22);
          ppcVar20 = ppcVar20 + (*ppcVar20 != (char *)0x0);
          iVar12 = 0;
          local_31a8 = (char *)(ulong)(iVar13 + uVar22);
LAB_00104dfd:
          if (iVar12 != 0) {
            if (iVar12 != 0x17) {
              return L'\0';
            }
            goto LAB_00104e28;
          }
          if ((*ppcVar20 == (char *)0x0) && (ppcVar20 = ppcVar23, until_failure == L'\0')) {
LAB_00104e28:
            free(local_3180);
            free(__dest);
            free(__s);
            if (L'\xffffffff' < verbosity) {
              putchar(10);
              puts("Totals:");
              printf("  Tests run:         %8d\n",local_31a8);
              printf("  Tests failed:      %8d\n",(ulong)local_3194);
              printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
              printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
              printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
            }
            if (failures == L'\0') {
              if (verbosity == L'\xffffffff') {
                putchar(10);
              }
              printf("%d tests passed, no failures\n",local_31a8);
            }
            else {
              putchar(10);
              puts("Failing tests:");
              piVar28 = &tests[0].failures;
              uVar26 = 0;
              do {
                if (*piVar28 != 0) {
                  printf("  %d: %s (%d failures)\n",uVar26 & 0xffffffff,*(char **)(piVar28 + -2));
                }
                uVar26 = uVar26 + 1;
                piVar28 = piVar28 + 6;
              } while (uVar26 != 0x17);
              putchar(10);
              printf("Details for failing tests: %s\n",tmpdir);
              putchar(10);
            }
            free(local_3188);
            assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                            ,L'Ⴤ',"..");
            rmdir(tmpdir);
            wVar3 = L'\x01';
            if (local_3194 == 0) {
              wVar3 = (uint)(L'\0' < skips & fail_if_tests_skipped) * 2;
            }
            return wVar3;
          }
        } while( true );
      }
      goto LAB_00105089;
    }
    goto LAB_0010508e;
  }
  sVar7 = strlen(__s);
  sVar8 = strlen(__dest);
  pcVar9 = __dest;
  __dest = (char *)realloc(__dest,sVar7 + sVar8 + 2);
  if (__dest != (char *)0x0) {
    sVar7 = strlen(__s);
    sVar8 = strlen(__dest);
    memmove(__dest + sVar7 + 1,__dest,sVar8 + 1);
    memcpy(__dest,__s,sVar7);
    sVar7 = strlen(__s);
    __dest[sVar7] = '/';
    goto LAB_00103fbe;
  }
  goto LAB_00105093;
LAB_001049b2:
  bVar1 = true;
  bVar29 = false;
LAB_001049b9:
  if (cVar17 != '^') {
    bVar29 = bVar1;
  }
  if (bVar29) {
    lVar11 = (long)(int)uVar21;
    uVar21 = uVar21 + 1;
    test_set[lVar11] = (wchar_t)lVar25;
  }
  lVar25 = lVar25 + 1;
  if (lVar25 == 0x17) goto LAB_00104a27;
  goto LAB_00104945;
LAB_00105041:
  main_cold_11();
switchD_00104147_caseD_65:
  main_cold_2();
LAB_0010504e:
  printf("*** INVALID Test %s\n",local_31a0);
  free(local_3188);
  free(local_3178);
  usage(local_3160);
  pcVar9 = local_3160;
LAB_0010507f:
  main_cold_13();
LAB_00105084:
  main_cold_9();
LAB_00105089:
  main_cold_8();
LAB_0010508e:
  main_cold_4();
LAB_00105093:
  main_cold_1();
LAB_00105098:
  main_cold_12();
  printf("Usage: %s [options] <test> <test> ...\n",pcVar9);
  puts("Default is to run all tests.");
  puts("Otherwise, specify the numbers of the tests you wish to run.");
  puts("Options:");
  puts("  -d  Dump core after any failure, for debugging.");
  puts("  -k  Keep all temp files.");
  puts("      Default: temp files for successful tests deleted.");
  puts("  -p <path>  Path to executable to be tested.");
  puts("      Default: path taken from BSDUNZIP environment variable.");
  puts("  -q  Quiet.");
  puts("  -r <dir>   Path to dir containing reference files.");
  puts("      Default: Current directory.");
  puts("  -s  Exit with code 2 if any tests were skipped.");
  puts("  -u  Keep running specified tests until one fails.");
  puts("  -v  Verbose.");
  puts("Available tests:");
  ppcVar23 = &tests[0].name;
  uVar26 = 0;
  do {
    printf("  %d: %s\n",uVar26 & 0xffffffff,*ppcVar23);
    uVar26 = uVar26 + 1;
    ppcVar23 = ppcVar23 + 3;
  } while (uVar26 != 0x17);
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = nitems(tests);
	int test_set[nitems(tests)];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	size_t testprogdir_len;
	size_t tmplen;
#ifdef PROGRAM
	size_t tmp2_len;
#endif
	time_t now;
	struct tm *tmptr;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
#ifdef PATH_MAX
	char tmpdir[PATH_MAX];
#else
	char tmpdir[256];
#endif
	char *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[32];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#if defined(PATH_MAX) && !defined(__GLIBC__)
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	testprogdir_len = strlen(progname) + 1;
	if ((testprogdir = malloc(testprogdir_len)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strncpy(testprogdir, progname, testprogdir_len);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir) + 1);
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";
	tmplen = strlen(tmp);
	while (tmplen > 0 && tmp[tmplen - 1] == '/')
		tmplen--;

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 's':
				fail_if_tests_skipped = 1;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		tmp2_len = strlen(testprogdir) + 1 + strlen(PROGRAM) + 1;
		if ((tmp2 = malloc(tmp2_len)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strncpy(tmp2, testprogdir, tmp2_len);
		strncat(tmp2, "/", tmp2_len);
		strncat(tmp2, PROGRAM, tmp2_len);
		testprogfile = tmp2;
	}

	{
		char *testprg;
		size_t testprg_len;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg_len = strlen(testprogfile) + 3;
		testprg = malloc(testprg_len);
		strncpy(testprg, "\"", testprg_len);
		strncat(testprg, testprogfile, testprg_len);
		strncat(testprg, "\"", testprg_len);
		testprog = testprg;
	}

	/* Sanity check: reject a relative path for refdir. */
	if (refdir != NULL) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* TODO: probably use PathIsRelative() from <shlwapi.h>. */
#else
		if (refdir[0] != '/') {
			fprintf(stderr,
			    "ERROR: Cannot use relative path for refdir\n");
			exit(1);
		}
#endif
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
#if defined(HAVE_LOCALTIME_S)
		tmptr = localtime_s(&tmbuf, &now) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
		tmptr = localtime_r(&now, &tmbuf);
#else
		tmptr = localtime(&now);
#endif
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S", tmptr);
		if (tmplen + 1 + strlen(progname) + 1 +
		    strlen(tmpdir_timestamp) + 1 + 3 >=
		    nitems(tmpdir)) {
			fprintf(stderr,
			    "ERROR: Temp directory pathname too long\n");
			exit(1);
		}
		snprintf(tmpdir, sizeof(tmpdir), "%.*s/%s.%s-%03d",
		    (int)tmplen, tmp, progname, tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir, 0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	if (tests_failed) return 1;

	if (fail_if_tests_skipped == 1 && skips > 0) return 2;

	return 0;
}